

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O1

UDataMemory *
doLoadFromCommonData
          (UBool isICUData,char *param_2,char *param_3,char *param_4,char *tocEntryName,char *path,
          char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
          UErrorCode *subErrorCode,UErrorCode *pErrorCode)

{
  bool bVar1;
  bool bVar2;
  UDataMemory *pUVar3;
  DataHeader *pHeader;
  UDataMemory *pUVar4;
  long lVar5;
  int commonDataIndex;
  int32_t length;
  UDataMemory *local_a0;
  UDataMemory local_68;
  
  bVar2 = false;
  commonDataIndex = -(uint)(isICUData == '\0');
  do {
    while( true ) {
      pUVar3 = openCommonData(param_3,commonDataIndex,(UErrorCode *)name);
      if ((pUVar3 != (UDataMemory *)0x0) && (*(int *)name < 1)) {
        pHeader = (*pUVar3->vFuncs->Lookup)(pUVar3,param_2,(int32_t *)&local_68,(UErrorCode *)name);
        bVar1 = true;
        if (pHeader != (DataHeader *)0x0) {
          pUVar4 = checkDataItem(pHeader,(UDataMemoryIsAcceptable *)path,type,param_4,tocEntryName,
                                 (UErrorCode *)name,(UErrorCode *)isAcceptable);
          if (*(int *)isAcceptable < 1) {
            if (pUVar4 != (UDataMemory *)0x0) {
              pUVar4->length = (int32_t)local_68.vFuncs;
              bVar1 = false;
              local_a0 = pUVar4;
            }
          }
          else {
            local_a0 = (UDataMemory *)0x0;
            bVar1 = false;
          }
        }
        if (!bVar1) {
          return local_a0;
        }
      }
      if (*(int *)name == 7) {
        *(undefined4 *)isAcceptable = 7;
        return (UDataMemory *)0x0;
      }
      if (isICUData == '\0') {
        return (UDataMemory *)0x0;
      }
      if (pUVar3 == (UDataMemory *)0x0) break;
      commonDataIndex = commonDataIndex + 1;
    }
    if (bVar2) {
      return (UDataMemory *)0x0;
    }
    if (gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i == 0) {
      pUVar3 = openCommonData("icudt63l",-1,(UErrorCode *)name);
      UDataMemory_init_63(&local_68);
      if (pUVar3 != (UDataMemory *)0x0) {
        UDatamemory_assign_63(&local_68,pUVar3);
        local_68.mapAddr = (void *)0x0;
        local_68.map = (void *)0x0;
        setCommonICUData(&local_68,'\0',(UErrorCode *)name);
      }
      gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
    }
    pUVar3 = udata_findCachedData("icudt63l",(UErrorCode *)name);
    bVar1 = false;
    if ((pUVar3 != (UDataMemory *)0x0) && (bVar1 = false, *(int *)name < 1)) {
      umtx_lock_63((UMutex *)0x0);
      lVar5 = 0;
      do {
        if ((*(long *)((long)gCommonICUDataArray + lVar5) != 0) &&
           (*(DataHeader **)(*(long *)((long)gCommonICUDataArray + lVar5) + 8) == pUVar3->pHeader))
        {
          bVar1 = true;
          goto LAB_002ccbbf;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x50);
      bVar1 = false;
LAB_002ccbbf:
      umtx_unlock_63((UMutex *)0x0);
    }
    bVar2 = true;
    if (!bVar1) {
      return (UDataMemory *)0x0;
    }
  } while( true );
}

Assistant:

static UDataMemory *doLoadFromCommonData(UBool isICUData, const char * /*pkgName*/, 
        const char * /*dataPath*/, const char * /*tocEntryPathSuffix*/, const char *tocEntryName,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    UDataMemory        *pEntryData;
    const DataHeader   *pHeader;
    UDataMemory        *pCommonData;
    int32_t            commonDataIndex;
    UBool              checkedExtendedICUData = FALSE;
    /* try to get common data.  The loop is for platforms such as the 390 that do
     *  not initially load the full set of ICU data.  If the lookup of an ICU data item
     *  fails, the full (but slower to load) set is loaded, the and the loop repeats,
     *  trying the lookup again.  Once the full set of ICU data is loaded, the loop wont
     *  repeat because the full set will be checked the first time through.
     *
     *  The loop also handles the fallback to a .dat file if the application linked
     *   to the stub data library rather than a real library.
     */
    for (commonDataIndex = isICUData ? 0 : -1;;) {
        pCommonData=openCommonData(path, commonDataIndex, subErrorCode); /** search for pkg **/

        if(U_SUCCESS(*subErrorCode) && pCommonData!=NULL) {
            int32_t length;

            /* look up the data piece in the common data */
            pHeader=pCommonData->vFuncs->Lookup(pCommonData, tocEntryName, &length, subErrorCode);
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: pHeader=%p - %s\n", tocEntryName, pHeader, u_errorName(*subErrorCode));
#endif

            if(pHeader!=NULL) {
                pEntryData = checkDataItem(pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
#ifdef UDATA_DEBUG
                fprintf(stderr, "pEntryData=%p\n", pEntryData);
#endif
                if (U_FAILURE(*pErrorCode)) {
                    return NULL;
                }
                if (pEntryData != NULL) {
                    pEntryData->length = length;
                    return pEntryData;
                }
            }
        }
        // If we failed due to being out-of-memory, then stop early and report the error.
        if (*subErrorCode == U_MEMORY_ALLOCATION_ERROR) {
            *pErrorCode = *subErrorCode;
            return NULL;
        }
        /* Data wasn't found.  If we were looking for an ICUData item and there is
         * more data available, load it and try again,
         * otherwise break out of this loop. */
        if (!isICUData) {
            return NULL;
        } else if (pCommonData != NULL) {
            ++commonDataIndex;  /* try the next data package */
        } else if ((!checkedExtendedICUData) && extendICUData(subErrorCode)) {
            checkedExtendedICUData = TRUE;
            /* try this data package slot again: it changed from NULL to non-NULL */
        } else {
            return NULL;
        }
    }
}